

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O0

int32_t ll_poll_scan_result(llabs_gateway_scan_results_t *scan_result,uint8_t *num_gw)

{
  _Bool _Var1;
  int32_t local_100;
  int32_t ret;
  uint8_t buff [209];
  uint8_t *num_gw_local;
  llabs_gateway_scan_results_t *scan_result_local;
  
  if ((scan_result == (llabs_gateway_scan_results_t *)0x0) || (num_gw == (uint8_t *)0x0)) {
    scan_result_local._4_4_ = -0x65;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      local_100 = hal_read_write(OP_GET_SCAN_INFO,(uint8_t *)0x0,0,_ll_ifc_message_buff,0xd1);
      if (-1 < local_100) {
        ll_gw_scan_result_deserialize(_ll_ifc_message_buff,scan_result,num_gw);
      }
      transport_mutex_release();
      if (-1 < local_100) {
        local_100 = 0;
      }
      scan_result_local._4_4_ = local_100;
    }
    else {
      scan_result_local._4_4_ = -0x71;
    }
  }
  return scan_result_local._4_4_;
}

Assistant:

int32_t ll_poll_scan_result(llabs_gateway_scan_results_t *scan_result, uint8_t *num_gw)
{
    if (scan_result == NULL || num_gw == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }
    
    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    uint8_t buff[GW_SCAN_INFO_BUFF_SIZE];

    int32_t ret = hal_read_write(OP_GET_SCAN_INFO, NULL, 0, &_ll_ifc_message_buff[0], GW_SCAN_INFO_BUFF_SIZE);

    if (ret < LL_IFC_ACK)
    {
       goto LL_POLL_SCAN_ERROR;
    }

    ll_gw_scan_result_deserialize(&_ll_ifc_message_buff[0], scan_result, num_gw);
    
LL_POLL_SCAN_ERROR:
    transport_mutex_release();
    return (ret >= 0) ? LL_IFC_ACK : ret;
}